

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

void rw::ps2::genericUninstanceCB
               (MatPipeline *pipe,Geometry *geo,uint32 *flags,Mesh *mesh,uint8 **data)

{
  PipeAttribute *pPVar1;
  int j;
  int i;
  uint8 *puVar2;
  TexCoords *pTVar3;
  uint8 uVar4;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  ulong uVar13;
  bool bVar14;
  Vertex v;
  RGBA *local_b8;
  TexCoords *local_b0;
  TexCoords *local_a8;
  int8 *local_88;
  Vertex local_70;
  char cVar5;
  
  if ((long)skinGlobals == 0) {
    bVar14 = false;
  }
  else {
    bVar14 = *(long *)((long)geo->texCoords + (long)skinGlobals + -0x38) != 0;
  }
  lVar8 = 0;
  puVar9 = (uint8 *)0x0;
  puVar10 = (uint8 *)0x0;
  puVar12 = (uint8 *)0x0;
  local_b8 = (RGBA *)0x0;
  local_b0 = (TexCoords *)0x0;
  local_a8 = (TexCoords *)0x0;
  puVar11 = (uint8 *)0x0;
  do {
    pPVar1 = pipe->attribs[lVar8];
    if (pPVar1 != (PipeAttribute *)0x0) {
      if (pPVar1 == (PipeAttribute *)attribXYZ) {
        puVar9 = data[lVar8];
      }
      else if (pPVar1 == (PipeAttribute *)attribXYZW) {
        puVar11 = data[lVar8];
      }
      else if (pPVar1 == (PipeAttribute *)attribUV) {
        local_a8 = (TexCoords *)data[lVar8];
      }
      else if (pPVar1 == (PipeAttribute *)attribUV2) {
        local_b0 = (TexCoords *)data[lVar8];
      }
      else if (pPVar1 == (PipeAttribute *)attribRGBA) {
        local_b8 = (RGBA *)data[lVar8];
      }
      else if (pPVar1 == (PipeAttribute *)attribNormal) {
        puVar12 = data[lVar8];
      }
      else if (pPVar1 == (PipeAttribute *)attribWeights) {
        puVar10 = data[lVar8];
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  if (puVar12 == (uint8 *)0x0) {
    uVar6 = 1;
  }
  else {
    uVar6 = (geo->flags & 0x10) + 1;
  }
  if (local_b8 != (RGBA *)0x0) {
    uVar6 = (geo->flags & 8) << 5 | uVar6;
  }
  uVar7 = uVar6;
  if ((local_a8 != (TexCoords *)0x0 || local_b0 != (TexCoords *)0x0) &&
     (uVar7 = uVar6 + 0x1000, geo->numTexCoordSets < 1)) {
    uVar7 = uVar6;
  }
  uVar6 = uVar7;
  if ((local_b0 != (TexCoords *)0x0) && (uVar6 = uVar7 + 0x2000, geo->numTexCoordSets < 2)) {
    uVar6 = uVar7;
  }
  uVar7 = uVar6 + 0x10000;
  if (puVar10 == (uint8 *)0x0) {
    uVar7 = uVar6;
  }
  if (!bVar14) {
    uVar7 = uVar6;
  }
  if (puVar11 == (uint8 *)0x0) {
    local_88 = (int8 *)0x0;
  }
  else {
    local_88 = getADCbitsForMesh(geo,mesh);
  }
  if (mesh->numIndices != 0) {
    uVar13 = 0;
    do {
      if ((uVar7 & 1) != 0) {
        puVar2 = puVar9;
        if (puVar9 == (uint8 *)0x0) {
          puVar2 = puVar11;
        }
        local_70.p.z = *(float32 *)(puVar2 + 8);
        local_70.p._0_8_ = *(undefined8 *)puVar2;
      }
      if ((uVar7 & 0x10) != 0) {
        local_70.n.x = (float32)((float)(int)(char)*puVar12 * 0.0078125);
        local_70.n.y = (float32)((float)(int)(char)puVar12[1] * 0.0078125);
        local_70.n.z = (float32)((float)(int)(char)puVar12[2] * 0.0078125);
      }
      if ((uVar7 >> 8 & 1) != 0) {
        local_70.c = *local_b8;
      }
      if ((uVar7 >> 0xc & 1) != 0) {
        pTVar3 = local_a8;
        if (local_a8 == (TexCoords *)0x0) {
          pTVar3 = local_b0;
        }
        local_70.t = *pTVar3;
      }
      if ((uVar7 >> 0xd & 1) != 0) {
        local_70.t1 = local_b0[1];
      }
      if ((uVar7 >> 0x10 & 1) != 0) {
        lVar8 = 0;
        do {
          local_70.w[lVar8] = (float32)(*(uint *)(puVar10 + lVar8 * 4) & 0xfffffc00);
          cVar5 = (char)(*(uint *)(puVar10 + lVar8 * 4) >> 2);
          uVar4 = cVar5 + 0xff;
          if (cVar5 == '\0') {
            uVar4 = '\0';
          }
          local_70.i[lVar8] = uVar4;
          if (((float)local_70.w[lVar8] == 0.0) && (!NAN((float)local_70.w[lVar8]))) {
            local_70.i[lVar8] = '\0';
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
      }
      i = findVertexSkin(geo,flags,uVar7,&local_70);
      if (i < 0) {
        i = geo->numVertices;
        geo->numVertices = i + 1;
      }
      mesh->indices[uVar13] = (uint16)i;
      if (local_88 != (int8 *)0x0) {
        local_88[uVar13] = *(float *)(puVar11 + 0xc) != 0.0;
      }
      flags[i] = uVar7;
      insertVertexSkin(geo,i,uVar7,&local_70);
      if (puVar9 != (uint8 *)0x0) {
        puVar9 = puVar9 + 0xc;
      }
      if (puVar11 != (uint8 *)0x0) {
        puVar11 = puVar11 + 0x10;
      }
      if (local_a8 != (TexCoords *)0x0) {
        local_a8 = local_a8 + 1;
      }
      if (local_b0 != (TexCoords *)0x0) {
        local_b0 = local_b0 + 2;
      }
      local_b8 = local_b8 + 1;
      puVar12 = puVar12 + 3;
      puVar10 = puVar10 + 0x10;
      uVar13 = uVar13 + 1;
    } while (uVar13 < mesh->numIndices);
  }
  return;
}

Assistant:

void
genericUninstanceCB(MatPipeline *pipe, Geometry *geo, uint32 flags[], Mesh *mesh, uint8 *data[])
{
	float32 *xyz = nil, *xyzw = nil;
	float32 *uv = nil, *uv2 = nil;
	uint8 *rgba = nil;
	int8 *normals = nil;
	uint32 *weights = nil;
	int8 *adc = nil;
	Skin *skin = nil;
	if(skinGlobals.geoOffset)
		skin = Skin::get(geo);

	PipeAttribute *a;
	for(int32 i = 0; i < (int)nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i])){
			if(a == &attribXYZ) xyz = (float32*)data[i];
			else if(a == &attribXYZW) xyzw = (float32*)data[i];
			else if(a == &attribUV) uv = (float32*)data[i];
			else if(a == &attribUV2) uv2 = (float32*)data[i];
			else if(a == &attribRGBA) rgba = data[i];
			else if(a == &attribNormal) normals = (int8*)data[i];
			else if(a == &attribWeights) weights = (uint32*)data[i];
		}

	uint32 mask = 0x1;	// vertices
	if(normals && geo->flags & Geometry::NORMALS)
		mask |= 0x10;
	if(rgba && geo->flags & Geometry::PRELIT)
		mask |= 0x100;
	if((uv || uv2) && geo->numTexCoordSets > 0)
		mask |= 0x1000;
	if(uv2 && geo->numTexCoordSets > 1)
		mask |= 0x2000;
	if(weights && skin)
		mask |= 0x10000;
	if(xyzw)
		adc = getADCbitsForMesh(geo, mesh);

	Vertex v;
	for(uint32 i = 0; i < mesh->numIndices; i++){
		if(mask & 0x1)
			memcpy(&v.p, xyz ? xyz : xyzw, 12);
		if(mask & 0x10){
			// TODO: figure out scaling :/
			v.n.x = normals[0]/128.0f;
			v.n.y = normals[1]/128.0f;
			v.n.z = normals[2]/128.0f;
		}
		if(mask & 0x100)
			memcpy(&v.c, rgba, 4);
		if(mask & 0x1000)
			memcpy(&v.t, uv ? uv : uv2, 8);
		if(mask & 0x2000)
			memcpy(&v.t1, uv2 + 2, 8);
		if(mask & 0x10000)
			for(int j = 0; j < 4; j++){
				((uint32*)v.w)[j] = weights[j] & ~0x3FF;
				v.i[j] = (weights[j] & 0x3FF) >> 2;
				if(v.i[j]) v.i[j]--;
				if(v.w[j] == 0.0f) v.i[j] = 0;
			}
		int32 idx = findVertexSkin(geo, flags, mask, &v);
		if(idx < 0)
			idx = geo->numVertices++;
		mesh->indices[i] = idx;
		if(adc)
			adc[i] = xyzw[3] != 0.0f;
		flags[idx] = mask;
		insertVertexSkin(geo, idx, mask, &v);
		if(xyz) xyz += 3;
		if(xyzw) xyzw += 4;
		if(uv) uv += 2;
		if(uv2) uv2 += 4;
		rgba += 4;
		normals += 3;
		weights += 4;
	}
}